

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O2

void __thiscall CTcLibParser::scan_needmacro(CTcLibParser *this,char *val)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  
  pcVar3 = val + -1;
  do {
    pcVar6 = pcVar3;
    cVar4 = pcVar6[1];
    pcVar3 = pcVar6 + 1;
    iVar2 = isspace((int)cVar4);
  } while (iVar2 != 0);
  lVar5 = 0;
  while (cVar4 != '\0') {
    iVar2 = isspace((int)cVar4);
    if (iVar2 != 0) break;
    pcVar1 = pcVar6 + 2;
    pcVar6 = pcVar6 + 1;
    lVar5 = lVar5 + 1;
    cVar4 = *pcVar1;
  }
  do {
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    iVar2 = isspace((int)*pcVar1);
  } while (iVar2 != 0);
  (*this->_vptr_CTcLibParser[0x10])(this,pcVar3,lVar5,pcVar6);
  return;
}

Assistant:

void CTcLibParser::scan_needmacro(const char *val)
{
    const char *p;
    const char *macro_name;
    size_t macro_len;

    /* skip leading whitespace */
    for (p = val ; isspace(*p) ; ++p) ;

    /* the macro starts here */
    macro_name = p;

    /* find the next whitspace, which separates the token */
    for ( ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length of the macro name */
    macro_len = p - macro_name;

    /* skip the whitspace */
    for ( ; isspace(*p) ; ++p) ;

    /* process the parsed needmacro definition */
    scan_parsed_needmacro(macro_name, macro_len, p);
}